

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

uint8_t * get_var_offs(int use_hbd,int bd)

{
  int off_index;
  int bd_local;
  int use_hbd_local;
  uint8_t *local_8;
  
  if (use_hbd == 0) {
    local_8 = AV1_VAR_OFFS;
  }
  else {
    local_8 = (uint8_t *)((ulong)get_var_offs::high_var_offs[bd + -8 >> 1] >> 1);
  }
  return local_8;
}

Assistant:

static const uint8_t *get_var_offs(int use_hbd, int bd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    assert(bd == 8 || bd == 10 || bd == 12);
    const int off_index = (bd - 8) >> 1;
    static const uint16_t *high_var_offs[3] = { AV1_HIGH_VAR_OFFS_8,
                                                AV1_HIGH_VAR_OFFS_10,
                                                AV1_HIGH_VAR_OFFS_12 };
    return CONVERT_TO_BYTEPTR(high_var_offs[off_index]);
  }
#else
  (void)use_hbd;
  (void)bd;
  assert(!use_hbd);
#endif
  assert(bd == 8);
  return AV1_VAR_OFFS;
}